

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_input_set_claim_script(wally_psbt_input *parent,uchar *bytes,size_t len)

{
  int iVar1;
  
  if (parent != (wally_psbt_input *)0x0) {
    iVar1 = replace_bytes(bytes,len,&parent->claim_script,&parent->claim_script_len);
    return iVar1;
  }
  return -2;
}

Assistant:

static int psbt_input_free(struct wally_psbt_input *input, bool free_parent)
{
    if (input) {
        wally_tx_free(input->utxo);
        wally_tx_output_free(input->witness_utxo);
        clear_and_free(input->redeem_script, input->redeem_script_len);
        clear_and_free(input->witness_script, input->witness_script_len);
        clear_and_free(input->final_scriptsig, input->final_scriptsig_len);
        wally_tx_witness_stack_free(input->final_witness);
        wally_map_clear(&input->keypaths);
        wally_map_clear(&input->signatures);
        wally_map_clear(&input->unknowns);

#ifdef BUILD_ELEMENTS
        clear_and_free(input->vbf, input->vbf_len);
        clear_and_free(input->asset, input->asset_len);
        clear_and_free(input->abf, input->abf_len);
        wally_tx_free(input->pegin_tx);
        clear_and_free(input->txoutproof, input->txoutproof_len);
        clear_and_free(input->genesis_blockhash, input->genesis_blockhash_len);
        clear_and_free(input->claim_script, input->claim_script_len);
#endif /* BUILD_ELEMENTS */

        wally_clear(input, sizeof(*input));
        if (free_parent)
            wally_free(input);
    }
    return WALLY_OK;
}